

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::next_code_point<char>(char *begin,char *end)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char *local_10;
  char *local_8;
  
  bVar1 = const_check<bool>(false);
  if ((bVar1) || (local_10 = in_RDI, ((int)*in_RDI & 0x80U) == 0)) {
    local_8 = in_RDI + 1;
  }
  else {
    do {
      local_10 = local_10 + 1;
      bVar1 = false;
      if (local_10 != in_RSI) {
        bVar1 = ((int)*local_10 & 0xc0U) == 0x80;
      }
      local_8 = local_10;
    } while (bVar1);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char* next_code_point(const Char* begin, const Char* end) {
  if (const_check(sizeof(Char) != 1) || (*begin & 0x80) == 0) return begin + 1;
  do {
    ++begin;
  } while (begin != end && (*begin & 0xc0) == 0x80);
  return begin;
}